

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::Generate
          (MessageBuilderGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  ImmutableFieldGenerator *pIVar4;
  Descriptor *pDVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  char *text;
  uint uVar10;
  long lVar11;
  string local_a0;
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  WriteMessageDocComment(printer,this->descriptor_);
  pDVar5 = this->descriptor_;
  if (*(int *)(pDVar5 + 0x68) < 1) {
    ClassNameResolver::GetClassName_abi_cxx11_((string *)&vars,this->name_resolver_,pDVar5,true);
    ExtraBuilderInterfaces_abi_cxx11_(&local_a0,(java *)this->descriptor_,descriptor_00);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_80._M_string_length = 2;
    local_80.field_2._M_local_buf[2] = '\0';
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                       ,"classname",(string *)&vars,"extra_interfaces",&local_a0,"ver",&local_80);
  }
  else {
    ClassNameResolver::GetClassName_abi_cxx11_((string *)&vars,this->name_resolver_,pDVar5,true);
    ExtraBuilderInterfaces_abi_cxx11_(&local_a0,(java *)this->descriptor_,descriptor);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_80._M_string_length = 2;
    local_80.field_2._M_local_buf[2] = '\0';
    io::Printer::Print(printer,
                       "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                       ,"classname",(string *)&vars,"extra_interfaces",&local_a0,"ver",&local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_80.field_2._M_local_buf[2],
                                      local_80.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)vars._M_t._M_impl._0_8_ !=
      &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)vars._M_t._M_impl._0_8_,
                    (ulong)((long)&(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  io::Printer::Indent(printer);
  GenerateDescriptorMethods(this,printer);
  GenerateCommonBuilderMethods(this,printer);
  bVar1 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  uVar6 = extraout_RDX;
  if (bVar1) {
    GenerateIsInitialized(this,printer);
    GenerateBuilderParsingMethods(this,printer);
    uVar6 = extraout_RDX_00;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar5 = this->descriptor_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pDVar5 + 0x38)) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      Context::GetOneofGeneratorInfo
                (this->context_,(OneofDescriptor *)(*(long *)(pDVar5 + 0x40) + lVar11));
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"oneof_name","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_a0);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      Context::GetOneofGeneratorInfo
                (this->context_,(OneofDescriptor *)(*(long *)(this->descriptor_ + 0x40) + lVar11));
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"oneof_capitalized_name","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_a0);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      iVar7 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        iVar7 = extraout_EDX_00;
      }
      SimpleItoa_abi_cxx11_
                (&local_a0,
                 (protobuf *)
                 (ulong)(uint)((int)((ulong)((*(long *)(this->descriptor_ + 0x40) -
                                             *(long *)(*(long *)(*(long *)(this->descriptor_ + 0x40)
                                                                 + 0x10 + lVar11) + 0x40)) + lVar11)
                                    >> 4) * -0x55555555),iVar7);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"oneof_index","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_80);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT53(local_80.field_2._M_allocated_capacity._3_5_,
                                 CONCAT12(local_80.field_2._M_local_buf[2],
                                          local_80.field_2._M_allocated_capacity._0_2_)) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(printer,&vars,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(printer,&vars,
                         "public $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n"
                        );
      io::Printer::Print(printer,"  onChanged();\n");
      io::Printer::Print(printer,"  return this;\n}\n\n");
      lVar9 = lVar9 + 1;
      pDVar5 = this->descriptor_;
      lVar11 = lVar11 + 0x30;
      uVar6 = extraout_RDX_01;
    } while (lVar9 < *(int *)(pDVar5 + 0x38));
  }
  if ((*(int *)(*(long *)(pDVar5 + 0x10) + 0x8c) != 3) ||
     (bVar1 = HasRepeatedFields(pDVar5), uVar6 = extraout_RDX_02, bVar1)) {
    pDVar5 = this->descriptor_;
    if (*(int *)(pDVar5 + 0x2c) < 1) {
      iVar7 = 0;
    }
    else {
      lVar9 = 0;
      lVar11 = 0;
      iVar7 = 0;
      do {
        pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar9));
        iVar2 = (*pIVar4->_vptr_ImmutableFieldGenerator[3])(pIVar4);
        iVar7 = iVar7 + iVar2;
        lVar11 = lVar11 + 1;
        pDVar5 = this->descriptor_;
        lVar9 = lVar9 + 0xa8;
        uVar6 = extraout_RDX_03;
      } while (lVar11 < *(int *)(pDVar5 + 0x2c));
    }
    if (0 < iVar7) {
      uVar8 = iVar7 + 0x1fU >> 5;
      uVar10 = 1;
      if (1 < uVar8) {
        uVar10 = uVar8;
      }
      uVar8 = 0;
      do {
        GetBitFieldName_abi_cxx11_(&local_a0,(java *)(ulong)uVar8,(int)uVar6);
        io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",&local_a0);
        uVar6 = extraout_RDX_04;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          uVar6 = extraout_RDX_05;
        }
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
  }
  pDVar5 = this->descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      io::Printer::Print(printer,"\n");
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar11));
      (*pIVar4->_vptr_ImmutableFieldGenerator[6])(pIVar4,printer);
      lVar9 = lVar9 + 1;
      pDVar5 = this->descriptor_;
      lVar11 = lVar11 + 0xa8;
    } while (lVar9 < *(int *)(pDVar5 + 0x2c));
  }
  text = 
  "public final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.setUnknownFields(unknownFields);\n}\n\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.mergeUnknownFields(unknownFields);\n}\n\n"
  ;
  if (*(int *)(*(long *)(pDVar5 + 0x10) + 0x8c) == 3) {
    text = 
    "public final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return this;\n}\n\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return this;\n}\n\n"
    ;
  }
  io::Printer::Print(printer,text);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
                     "full_name",*(string **)(this->descriptor_ + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageBuilderGenerator::
Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n"
      "      $classname$, Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_),
      "ver", GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_),
      "ver", GeneratedCodeVersionSuffix());
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateBuilderParsingMethods(printer);
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        descriptor_->oneof_decl(i))->capitalized_name;
    vars["oneof_index"] = SimpleItoa(descriptor_->oneof_decl(i)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // oneofCase() and clearOneof()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "    get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n"
      "public Builder clear$oneof_capitalized_name$() {\n"
      "  $oneof_name$Case_ = 0;\n"
      "  $oneof_name$_ = null;\n");
    printer->Print("  onChanged();\n");
    printer->Print(
      "  return this;\n"
      "}\n"
      "\n");
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForBuilder();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
                     .GenerateBuilderMembers(printer);
  }

  if (!PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return this;\n"
      "}\n"
      "\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return this;\n"
      "}\n"
      "\n");
  } else {
    // Override methods declared in GeneratedMessage to return the concrete
    // generated type so callsites won't depend on GeneratedMessage. This
    // is needed to keep binary compatibility when we change generated code
    // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
    // we changed all generated code to subclass GeneratedMessageV3).
    printer->Print(
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.setUnknownFields(unknownFields);\n"
      "}\n"
      "\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.mergeUnknownFields(unknownFields);\n"
      "}\n"
      "\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}